

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::InlineWriter::InitParameters(InlineWriter *this)

{
  IO *pIVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  _Base_ptr local_108;
  InlineWriter *local_100;
  _Base_ptr local_f8;
  string key;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string value;
  
  pIVar1 = (this->super_Engine).m_IO;
  local_f8 = &(pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_100 = this;
  for (local_108 = (pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_108 != local_f8; local_108 = (_Base_ptr)std::_Rb_tree_increment(local_108)) {
    std::__cxx11::string::string((string *)&key,(string *)(local_108 + 1));
    sVar3 = key._M_string_length;
    _Var2 = key._M_dataplus;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      iVar5 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar5;
    }
    std::__cxx11::string::string((string *)&value,(string *)(local_108 + 2));
    bVar4 = std::operator==(&key,"verbose");
    if (bVar4) {
      uVar6 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
      local_100->m_Verbosity = uVar6;
      if (5 < uVar6) {
        std::__cxx11::string::string((string *)&local_70,"Engine",&local_109);
        std::__cxx11::string::string((string *)&local_90,"InlineWriter",&local_10a);
        std::__cxx11::string::string((string *)&local_b0,"InitParameters",&local_10b);
        std::__cxx11::string::string
                  ((string *)&local_d0,
                   "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                   ,&local_10c);
        helper::Throw<std::invalid_argument>(&local_70,&local_90,&local_b0,&local_d0,-1);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  }
  return;
}

Assistant:

void InlineWriter::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "InlineWriter", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}